

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall doctest::Context::parseArgs(Context *this,int argc,char **argv,bool withDefaults)

{
  bool bVar1;
  bool bVar2;
  reference pvVar3;
  byte local_25e;
  byte local_23e;
  String local_b8;
  String local_a0;
  byte local_81;
  String local_80;
  String local_58;
  undefined1 local_40 [8];
  String strRes;
  int intRes;
  bool withDefaults_local;
  char **argv_local;
  int argc_local;
  Context *this_local;
  
  strRes.field_0.buf[0x17] = withDefaults;
  pvVar3 = std::
           vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
           ::operator[](&this->p->filters,0);
  anon_unknown_14::parseCommaSepArgs(argc,argv,"dt-source-file=",pvVar3);
  pvVar3 = std::
           vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
           ::operator[](&this->p->filters,0);
  anon_unknown_14::parseCommaSepArgs(argc,argv,"dt-sf=",pvVar3);
  pvVar3 = std::
           vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
           ::operator[](&this->p->filters,1);
  anon_unknown_14::parseCommaSepArgs(argc,argv,"dt-source-file-exclude=",pvVar3);
  pvVar3 = std::
           vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
           ::operator[](&this->p->filters,1);
  anon_unknown_14::parseCommaSepArgs(argc,argv,"dt-sfe=",pvVar3);
  pvVar3 = std::
           vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
           ::operator[](&this->p->filters,2);
  anon_unknown_14::parseCommaSepArgs(argc,argv,"dt-test-suite=",pvVar3);
  pvVar3 = std::
           vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
           ::operator[](&this->p->filters,2);
  anon_unknown_14::parseCommaSepArgs(argc,argv,"dt-ts=",pvVar3);
  pvVar3 = std::
           vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
           ::operator[](&this->p->filters,3);
  anon_unknown_14::parseCommaSepArgs(argc,argv,"dt-test-suite-exclude=",pvVar3);
  pvVar3 = std::
           vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
           ::operator[](&this->p->filters,3);
  anon_unknown_14::parseCommaSepArgs(argc,argv,"dt-tse=",pvVar3);
  pvVar3 = std::
           vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
           ::operator[](&this->p->filters,4);
  anon_unknown_14::parseCommaSepArgs(argc,argv,"dt-test-case=",pvVar3);
  pvVar3 = std::
           vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
           ::operator[](&this->p->filters,4);
  anon_unknown_14::parseCommaSepArgs(argc,argv,"dt-tc=",pvVar3);
  pvVar3 = std::
           vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
           ::operator[](&this->p->filters,5);
  anon_unknown_14::parseCommaSepArgs(argc,argv,"dt-test-case-exclude=",pvVar3);
  pvVar3 = std::
           vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
           ::operator[](&this->p->filters,5);
  anon_unknown_14::parseCommaSepArgs(argc,argv,"dt-tce=",pvVar3);
  pvVar3 = std::
           vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
           ::operator[](&this->p->filters,6);
  anon_unknown_14::parseCommaSepArgs(argc,argv,"dt-subcase=",pvVar3);
  pvVar3 = std::
           vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
           ::operator[](&this->p->filters,6);
  anon_unknown_14::parseCommaSepArgs(argc,argv,"dt-sc=",pvVar3);
  pvVar3 = std::
           vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
           ::operator[](&this->p->filters,7);
  anon_unknown_14::parseCommaSepArgs(argc,argv,"dt-subcase-exclude=",pvVar3);
  pvVar3 = std::
           vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
           ::operator[](&this->p->filters,7);
  anon_unknown_14::parseCommaSepArgs(argc,argv,"dt-sce=",pvVar3);
  pvVar3 = std::
           vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
           ::operator[](&this->p->filters,8);
  anon_unknown_14::parseCommaSepArgs(argc,argv,"dt-reporters=",pvVar3);
  pvVar3 = std::
           vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
           ::operator[](&this->p->filters,8);
  anon_unknown_14::parseCommaSepArgs(argc,argv,"dt-r=",pvVar3);
  strRes.field_0._16_4_ = 0;
  String::String((String *)local_40);
  local_81 = 0;
  String::String(&local_58,"");
  bVar1 = anon_unknown_14::parseOption(argc,argv,"dt-out=",(String *)local_40,&local_58);
  local_23e = 1;
  if (!bVar1) {
    String::String(&local_80,"");
    local_81 = 1;
    bVar1 = anon_unknown_14::parseOption(argc,argv,"dt-o=",(String *)local_40,&local_80);
    local_23e = 1;
    if (!bVar1) {
      local_23e = strRes.field_0.buf[0x17];
    }
  }
  if ((local_81 & 1) != 0) {
    String::~String(&local_80);
  }
  String::~String(&local_58);
  if ((local_23e & 1) != 0) {
    String::operator=(&(this->p->super_ContextOptions).out,(String *)local_40);
  }
  bVar1 = false;
  String::String(&local_a0,"file");
  bVar2 = anon_unknown_14::parseOption(argc,argv,"dt-order-by=",(String *)local_40,&local_a0);
  local_25e = 1;
  if (!bVar2) {
    String::String(&local_b8,"file");
    bVar1 = true;
    bVar2 = anon_unknown_14::parseOption(argc,argv,"dt-ob=",(String *)local_40,&local_b8);
    local_25e = 1;
    if (!bVar2) {
      local_25e = strRes.field_0.buf[0x17];
    }
  }
  if (bVar1) {
    String::~String(&local_b8);
  }
  String::~String(&local_a0);
  if ((local_25e & 1) != 0) {
    String::operator=(&(this->p->super_ContextOptions).order_by,(String *)local_40);
  }
  bVar1 = anon_unknown_14::parseIntOption
                    (argc,argv,"dt-rand-seed=",option_int,(int *)(strRes.field_0.buf + 0x10));
  if ((bVar1) ||
     (bVar1 = anon_unknown_14::parseIntOption
                        (argc,argv,"dt-rs=",option_int,(int *)(strRes.field_0.buf + 0x10)), bVar1))
  {
    (this->p->super_ContextOptions).rand_seed = strRes.field_0._16_4_;
  }
  else if ((strRes.field_0.buf[0x17] & 1U) != 0) {
    (this->p->super_ContextOptions).rand_seed = 0;
  }
  bVar1 = anon_unknown_14::parseIntOption
                    (argc,argv,"dt-first=",option_int,(int *)(strRes.field_0.buf + 0x10));
  if ((bVar1) ||
     (bVar1 = anon_unknown_14::parseIntOption
                        (argc,argv,"dt-f=",option_int,(int *)(strRes.field_0.buf + 0x10)), bVar1)) {
    (this->p->super_ContextOptions).first = strRes.field_0._16_4_;
  }
  else if ((strRes.field_0.buf[0x17] & 1U) != 0) {
    (this->p->super_ContextOptions).first = 0;
  }
  bVar1 = anon_unknown_14::parseIntOption
                    (argc,argv,"dt-last=",option_int,(int *)(strRes.field_0.buf + 0x10));
  if ((bVar1) ||
     (bVar1 = anon_unknown_14::parseIntOption
                        (argc,argv,"dt-l=",option_int,(int *)(strRes.field_0.buf + 0x10)), bVar1)) {
    (this->p->super_ContextOptions).last = strRes.field_0._16_4_;
  }
  else if ((strRes.field_0.buf[0x17] & 1U) != 0) {
    (this->p->super_ContextOptions).last = 0xffffffff;
  }
  bVar1 = anon_unknown_14::parseIntOption
                    (argc,argv,"dt-abort-after=",option_int,(int *)(strRes.field_0.buf + 0x10));
  if ((bVar1) ||
     (bVar1 = anon_unknown_14::parseIntOption
                        (argc,argv,"dt-aa=",option_int,(int *)(strRes.field_0.buf + 0x10)), bVar1))
  {
    (this->p->super_ContextOptions).abort_after = strRes.field_0._16_4_;
  }
  else if ((strRes.field_0.buf[0x17] & 1U) != 0) {
    (this->p->super_ContextOptions).abort_after = 0;
  }
  bVar1 = anon_unknown_14::parseIntOption
                    (argc,argv,"dt-subcase-filter-levels=",option_int,
                     (int *)(strRes.field_0.buf + 0x10));
  if ((bVar1) ||
     (bVar1 = anon_unknown_14::parseIntOption
                        (argc,argv,"dt-scfl=",option_int,(int *)(strRes.field_0.buf + 0x10)), bVar1)
     ) {
    (this->p->super_ContextOptions).subcase_filter_levels = strRes.field_0._16_4_;
  }
  else if ((strRes.field_0.buf[0x17] & 1U) != 0) {
    (this->p->super_ContextOptions).subcase_filter_levels = 0x7fffffff;
  }
  bVar1 = anon_unknown_14::parseIntOption
                    (argc,argv,"dt-success=",option_bool,(int *)(strRes.field_0.buf + 0x10));
  if ((bVar1) ||
     (bVar1 = anon_unknown_14::parseIntOption
                        (argc,argv,"dt-s=",option_bool,(int *)(strRes.field_0.buf + 0x10)), bVar1))
  {
    (this->p->super_ContextOptions).success = strRes.field_0._16_4_ != 0;
  }
  else {
    bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-success");
    if ((bVar1) || (bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-s"), bVar1)) {
      (this->p->super_ContextOptions).success = true;
    }
    else if ((strRes.field_0.buf[0x17] & 1U) != 0) {
      (this->p->super_ContextOptions).success = false;
    }
  }
  bVar1 = anon_unknown_14::parseIntOption
                    (argc,argv,"dt-case-sensitive=",option_bool,(int *)(strRes.field_0.buf + 0x10));
  if ((bVar1) ||
     (bVar1 = anon_unknown_14::parseIntOption
                        (argc,argv,"dt-cs=",option_bool,(int *)(strRes.field_0.buf + 0x10)), bVar1))
  {
    (this->p->super_ContextOptions).case_sensitive = strRes.field_0._16_4_ != 0;
  }
  else {
    bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-case-sensitive");
    if ((bVar1) || (bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-cs"), bVar1)) {
      (this->p->super_ContextOptions).case_sensitive = true;
    }
    else if ((strRes.field_0.buf[0x17] & 1U) != 0) {
      (this->p->super_ContextOptions).case_sensitive = false;
    }
  }
  bVar1 = anon_unknown_14::parseIntOption
                    (argc,argv,"dt-exit=",option_bool,(int *)(strRes.field_0.buf + 0x10));
  if ((bVar1) ||
     (bVar1 = anon_unknown_14::parseIntOption
                        (argc,argv,"dt-e=",option_bool,(int *)(strRes.field_0.buf + 0x10)), bVar1))
  {
    (this->p->super_ContextOptions).exit = strRes.field_0._16_4_ != 0;
  }
  else {
    bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-exit");
    if ((bVar1) || (bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-e"), bVar1)) {
      (this->p->super_ContextOptions).exit = true;
    }
    else if ((strRes.field_0.buf[0x17] & 1U) != 0) {
      (this->p->super_ContextOptions).exit = false;
    }
  }
  bVar1 = anon_unknown_14::parseIntOption
                    (argc,argv,"dt-duration=",option_bool,(int *)(strRes.field_0.buf + 0x10));
  if ((bVar1) ||
     (bVar1 = anon_unknown_14::parseIntOption
                        (argc,argv,"dt-d=",option_bool,(int *)(strRes.field_0.buf + 0x10)), bVar1))
  {
    (this->p->super_ContextOptions).duration = strRes.field_0._16_4_ != 0;
  }
  else {
    bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-duration");
    if ((bVar1) || (bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-d"), bVar1)) {
      (this->p->super_ContextOptions).duration = true;
    }
    else if ((strRes.field_0.buf[0x17] & 1U) != 0) {
      (this->p->super_ContextOptions).duration = false;
    }
  }
  bVar1 = anon_unknown_14::parseIntOption
                    (argc,argv,"dt-minimal=",option_bool,(int *)(strRes.field_0.buf + 0x10));
  if ((bVar1) ||
     (bVar1 = anon_unknown_14::parseIntOption
                        (argc,argv,"dt-m=",option_bool,(int *)(strRes.field_0.buf + 0x10)), bVar1))
  {
    (this->p->super_ContextOptions).minimal = strRes.field_0._16_4_ != 0;
  }
  else {
    bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-minimal");
    if ((bVar1) || (bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-m"), bVar1)) {
      (this->p->super_ContextOptions).minimal = true;
    }
    else if ((strRes.field_0.buf[0x17] & 1U) != 0) {
      (this->p->super_ContextOptions).minimal = false;
    }
  }
  bVar1 = anon_unknown_14::parseIntOption
                    (argc,argv,"dt-quiet=",option_bool,(int *)(strRes.field_0.buf + 0x10));
  if ((bVar1) ||
     (bVar1 = anon_unknown_14::parseIntOption
                        (argc,argv,"dt-q=",option_bool,(int *)(strRes.field_0.buf + 0x10)), bVar1))
  {
    (this->p->super_ContextOptions).quiet = strRes.field_0._16_4_ != 0;
  }
  else {
    bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-quiet");
    if ((bVar1) || (bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-q"), bVar1)) {
      (this->p->super_ContextOptions).quiet = true;
    }
    else if ((strRes.field_0.buf[0x17] & 1U) != 0) {
      (this->p->super_ContextOptions).quiet = false;
    }
  }
  bVar1 = anon_unknown_14::parseIntOption
                    (argc,argv,"dt-no-throw=",option_bool,(int *)(strRes.field_0.buf + 0x10));
  if ((bVar1) ||
     (bVar1 = anon_unknown_14::parseIntOption
                        (argc,argv,"dt-nt=",option_bool,(int *)(strRes.field_0.buf + 0x10)), bVar1))
  {
    (this->p->super_ContextOptions).no_throw = strRes.field_0._16_4_ != 0;
  }
  else {
    bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-no-throw");
    if ((bVar1) || (bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-nt"), bVar1)) {
      (this->p->super_ContextOptions).no_throw = true;
    }
    else if ((strRes.field_0.buf[0x17] & 1U) != 0) {
      (this->p->super_ContextOptions).no_throw = false;
    }
  }
  bVar1 = anon_unknown_14::parseIntOption
                    (argc,argv,"dt-no-exitcode=",option_bool,(int *)(strRes.field_0.buf + 0x10));
  if ((bVar1) ||
     (bVar1 = anon_unknown_14::parseIntOption
                        (argc,argv,"dt-ne=",option_bool,(int *)(strRes.field_0.buf + 0x10)), bVar1))
  {
    (this->p->super_ContextOptions).no_exitcode = strRes.field_0._16_4_ != 0;
  }
  else {
    bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-no-exitcode");
    if ((bVar1) || (bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-ne"), bVar1)) {
      (this->p->super_ContextOptions).no_exitcode = true;
    }
    else if ((strRes.field_0.buf[0x17] & 1U) != 0) {
      (this->p->super_ContextOptions).no_exitcode = false;
    }
  }
  bVar1 = anon_unknown_14::parseIntOption
                    (argc,argv,"dt-no-run=",option_bool,(int *)(strRes.field_0.buf + 0x10));
  if ((bVar1) ||
     (bVar1 = anon_unknown_14::parseIntOption
                        (argc,argv,"dt-nr=",option_bool,(int *)(strRes.field_0.buf + 0x10)), bVar1))
  {
    (this->p->super_ContextOptions).no_run = strRes.field_0._16_4_ != 0;
  }
  else {
    bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-no-run");
    if ((bVar1) || (bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-nr"), bVar1)) {
      (this->p->super_ContextOptions).no_run = true;
    }
    else if ((strRes.field_0.buf[0x17] & 1U) != 0) {
      (this->p->super_ContextOptions).no_run = false;
    }
  }
  bVar1 = anon_unknown_14::parseIntOption
                    (argc,argv,"dt-no-intro=",option_bool,(int *)(strRes.field_0.buf + 0x10));
  if ((bVar1) ||
     (bVar1 = anon_unknown_14::parseIntOption
                        (argc,argv,"dt-ni=",option_bool,(int *)(strRes.field_0.buf + 0x10)), bVar1))
  {
    (this->p->super_ContextOptions).no_intro = strRes.field_0._16_4_ != 0;
  }
  else {
    bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-no-intro");
    if ((bVar1) || (bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-ni"), bVar1)) {
      (this->p->super_ContextOptions).no_intro = true;
    }
    else if ((strRes.field_0.buf[0x17] & 1U) != 0) {
      (this->p->super_ContextOptions).no_intro = false;
    }
  }
  bVar1 = anon_unknown_14::parseIntOption
                    (argc,argv,"dt-no-version=",option_bool,(int *)(strRes.field_0.buf + 0x10));
  if ((bVar1) ||
     (bVar1 = anon_unknown_14::parseIntOption
                        (argc,argv,"dt-nv=",option_bool,(int *)(strRes.field_0.buf + 0x10)), bVar1))
  {
    (this->p->super_ContextOptions).no_version = strRes.field_0._16_4_ != 0;
  }
  else {
    bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-no-version");
    if ((bVar1) || (bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-nv"), bVar1)) {
      (this->p->super_ContextOptions).no_version = true;
    }
    else if ((strRes.field_0.buf[0x17] & 1U) != 0) {
      (this->p->super_ContextOptions).no_version = false;
    }
  }
  bVar1 = anon_unknown_14::parseIntOption
                    (argc,argv,"dt-no-colors=",option_bool,(int *)(strRes.field_0.buf + 0x10));
  if ((bVar1) ||
     (bVar1 = anon_unknown_14::parseIntOption
                        (argc,argv,"dt-nc=",option_bool,(int *)(strRes.field_0.buf + 0x10)), bVar1))
  {
    (this->p->super_ContextOptions).no_colors = strRes.field_0._16_4_ != 0;
  }
  else {
    bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-no-colors");
    if ((bVar1) || (bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-nc"), bVar1)) {
      (this->p->super_ContextOptions).no_colors = true;
    }
    else if ((strRes.field_0.buf[0x17] & 1U) != 0) {
      (this->p->super_ContextOptions).no_colors = false;
    }
  }
  bVar1 = anon_unknown_14::parseIntOption
                    (argc,argv,"dt-force-colors=",option_bool,(int *)(strRes.field_0.buf + 0x10));
  if ((bVar1) ||
     (bVar1 = anon_unknown_14::parseIntOption
                        (argc,argv,"dt-fc=",option_bool,(int *)(strRes.field_0.buf + 0x10)), bVar1))
  {
    (this->p->super_ContextOptions).force_colors = strRes.field_0._16_4_ != 0;
  }
  else {
    bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-force-colors");
    if ((bVar1) || (bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-fc"), bVar1)) {
      (this->p->super_ContextOptions).force_colors = true;
    }
    else if ((strRes.field_0.buf[0x17] & 1U) != 0) {
      (this->p->super_ContextOptions).force_colors = false;
    }
  }
  bVar1 = anon_unknown_14::parseIntOption
                    (argc,argv,"dt-no-breaks=",option_bool,(int *)(strRes.field_0.buf + 0x10));
  if ((bVar1) ||
     (bVar1 = anon_unknown_14::parseIntOption
                        (argc,argv,"dt-nb=",option_bool,(int *)(strRes.field_0.buf + 0x10)), bVar1))
  {
    (this->p->super_ContextOptions).no_breaks = strRes.field_0._16_4_ != 0;
  }
  else {
    bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-no-breaks");
    if ((bVar1) || (bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-nb"), bVar1)) {
      (this->p->super_ContextOptions).no_breaks = true;
    }
    else if ((strRes.field_0.buf[0x17] & 1U) != 0) {
      (this->p->super_ContextOptions).no_breaks = false;
    }
  }
  bVar1 = anon_unknown_14::parseIntOption
                    (argc,argv,"dt-no-skip=",option_bool,(int *)(strRes.field_0.buf + 0x10));
  if ((bVar1) ||
     (bVar1 = anon_unknown_14::parseIntOption
                        (argc,argv,"dt-ns=",option_bool,(int *)(strRes.field_0.buf + 0x10)), bVar1))
  {
    (this->p->super_ContextOptions).no_skip = strRes.field_0._16_4_ != 0;
  }
  else {
    bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-no-skip");
    if ((bVar1) || (bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-ns"), bVar1)) {
      (this->p->super_ContextOptions).no_skip = true;
    }
    else if ((strRes.field_0.buf[0x17] & 1U) != 0) {
      (this->p->super_ContextOptions).no_skip = false;
    }
  }
  bVar1 = anon_unknown_14::parseIntOption
                    (argc,argv,"dt-gnu-file-line=",option_bool,(int *)(strRes.field_0.buf + 0x10));
  if ((bVar1) ||
     (bVar1 = anon_unknown_14::parseIntOption
                        (argc,argv,"dt-gfl=",option_bool,(int *)(strRes.field_0.buf + 0x10)), bVar1)
     ) {
    (this->p->super_ContextOptions).gnu_file_line = strRes.field_0._16_4_ != 0;
  }
  else {
    bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-gnu-file-line");
    if ((bVar1) || (bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-gfl"), bVar1)) {
      (this->p->super_ContextOptions).gnu_file_line = true;
    }
    else if ((strRes.field_0.buf[0x17] & 1U) != 0) {
      (this->p->super_ContextOptions).gnu_file_line = true;
    }
  }
  bVar1 = anon_unknown_14::parseIntOption
                    (argc,argv,"dt-no-path-filenames=",option_bool,
                     (int *)(strRes.field_0.buf + 0x10));
  if ((bVar1) ||
     (bVar1 = anon_unknown_14::parseIntOption
                        (argc,argv,"dt-npf=",option_bool,(int *)(strRes.field_0.buf + 0x10)), bVar1)
     ) {
    (this->p->super_ContextOptions).no_path_in_filenames = strRes.field_0._16_4_ != 0;
  }
  else {
    bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-no-path-filenames");
    if ((bVar1) || (bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-npf"), bVar1)) {
      (this->p->super_ContextOptions).no_path_in_filenames = true;
    }
    else if ((strRes.field_0.buf[0x17] & 1U) != 0) {
      (this->p->super_ContextOptions).no_path_in_filenames = false;
    }
  }
  bVar1 = anon_unknown_14::parseIntOption
                    (argc,argv,"dt-no-line-numbers=",option_bool,(int *)(strRes.field_0.buf + 0x10))
  ;
  if ((bVar1) ||
     (bVar1 = anon_unknown_14::parseIntOption
                        (argc,argv,"dt-nln=",option_bool,(int *)(strRes.field_0.buf + 0x10)), bVar1)
     ) {
    (this->p->super_ContextOptions).no_line_numbers = strRes.field_0._16_4_ != 0;
  }
  else {
    bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-no-line-numbers");
    if ((bVar1) || (bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-nln"), bVar1)) {
      (this->p->super_ContextOptions).no_line_numbers = true;
    }
    else if ((strRes.field_0.buf[0x17] & 1U) != 0) {
      (this->p->super_ContextOptions).no_line_numbers = false;
    }
  }
  bVar1 = anon_unknown_14::parseIntOption
                    (argc,argv,"dt-no-debug-output=",option_bool,(int *)(strRes.field_0.buf + 0x10))
  ;
  if ((bVar1) ||
     (bVar1 = anon_unknown_14::parseIntOption
                        (argc,argv,"dt-ndo=",option_bool,(int *)(strRes.field_0.buf + 0x10)), bVar1)
     ) {
    (this->p->super_ContextOptions).no_debug_output = strRes.field_0._16_4_ != 0;
  }
  else {
    bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-no-debug-output");
    if ((bVar1) || (bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-ndo"), bVar1)) {
      (this->p->super_ContextOptions).no_debug_output = true;
    }
    else if ((strRes.field_0.buf[0x17] & 1U) != 0) {
      (this->p->super_ContextOptions).no_debug_output = false;
    }
  }
  bVar1 = anon_unknown_14::parseIntOption
                    (argc,argv,"dt-no-skipped-summary=",option_bool,
                     (int *)(strRes.field_0.buf + 0x10));
  if ((bVar1) ||
     (bVar1 = anon_unknown_14::parseIntOption
                        (argc,argv,"dt-nss=",option_bool,(int *)(strRes.field_0.buf + 0x10)), bVar1)
     ) {
    (this->p->super_ContextOptions).no_skipped_summary = strRes.field_0._16_4_ != 0;
  }
  else {
    bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-no-skipped-summary");
    if ((bVar1) || (bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-nss"), bVar1)) {
      (this->p->super_ContextOptions).no_skipped_summary = true;
    }
    else if ((strRes.field_0.buf[0x17] & 1U) != 0) {
      (this->p->super_ContextOptions).no_skipped_summary = false;
    }
  }
  bVar1 = anon_unknown_14::parseIntOption
                    (argc,argv,"dt-no-time-in-output=",option_bool,
                     (int *)(strRes.field_0.buf + 0x10));
  if ((bVar1) ||
     (bVar1 = anon_unknown_14::parseIntOption
                        (argc,argv,"dt-ntio=",option_bool,(int *)(strRes.field_0.buf + 0x10)), bVar1
     )) {
    (this->p->super_ContextOptions).no_time_in_output = strRes.field_0._16_4_ != 0;
  }
  else {
    bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-no-time-in-output");
    if ((bVar1) || (bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-ntio"), bVar1)) {
      (this->p->super_ContextOptions).no_time_in_output = true;
    }
    else if ((strRes.field_0.buf[0x17] & 1U) != 0) {
      (this->p->super_ContextOptions).no_time_in_output = false;
    }
  }
  if ((strRes.field_0.buf[0x17] & 1U) != 0) {
    (this->p->super_ContextOptions).help = false;
    (this->p->super_ContextOptions).version = false;
    (this->p->super_ContextOptions).count = false;
    (this->p->super_ContextOptions).list_test_cases = false;
    (this->p->super_ContextOptions).list_test_suites = false;
    (this->p->super_ContextOptions).list_reporters = false;
  }
  bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-help");
  if (((bVar1) || (bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-h"), bVar1)) ||
     (bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-?"), bVar1)) {
    (this->p->super_ContextOptions).help = true;
    (this->p->super_ContextOptions).exit = true;
  }
  bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-version");
  if ((bVar1) || (bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-v"), bVar1)) {
    (this->p->super_ContextOptions).version = true;
    (this->p->super_ContextOptions).exit = true;
  }
  bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-count");
  if ((bVar1) || (bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-c"), bVar1)) {
    (this->p->super_ContextOptions).count = true;
    (this->p->super_ContextOptions).exit = true;
  }
  bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-list-test-cases");
  if ((bVar1) || (bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-ltc"), bVar1)) {
    (this->p->super_ContextOptions).list_test_cases = true;
    (this->p->super_ContextOptions).exit = true;
  }
  bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-list-test-suites");
  if ((bVar1) || (bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-lts"), bVar1)) {
    (this->p->super_ContextOptions).list_test_suites = true;
    (this->p->super_ContextOptions).exit = true;
  }
  bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-list-reporters");
  if ((bVar1) || (bVar1 = anon_unknown_14::parseFlag(argc,argv,"dt-lr"), bVar1)) {
    (this->p->super_ContextOptions).list_reporters = true;
    (this->p->super_ContextOptions).exit = true;
  }
  String::~String((String *)local_40);
  return;
}

Assistant:

void Context::parseArgs(int argc, const char* const* argv, bool withDefaults) {
    using namespace detail;

    // clang-format off
    parseCommaSepArgs(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "source-file=",        p->filters[0]);
    parseCommaSepArgs(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "sf=",                 p->filters[0]);
    parseCommaSepArgs(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "source-file-exclude=",p->filters[1]);
    parseCommaSepArgs(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "sfe=",                p->filters[1]);
    parseCommaSepArgs(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "test-suite=",         p->filters[2]);
    parseCommaSepArgs(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "ts=",                 p->filters[2]);
    parseCommaSepArgs(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "test-suite-exclude=", p->filters[3]);
    parseCommaSepArgs(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "tse=",                p->filters[3]);
    parseCommaSepArgs(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "test-case=",          p->filters[4]);
    parseCommaSepArgs(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "tc=",                 p->filters[4]);
    parseCommaSepArgs(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "test-case-exclude=",  p->filters[5]);
    parseCommaSepArgs(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "tce=",                p->filters[5]);
    parseCommaSepArgs(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "subcase=",            p->filters[6]);
    parseCommaSepArgs(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "sc=",                 p->filters[6]);
    parseCommaSepArgs(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "subcase-exclude=",    p->filters[7]);
    parseCommaSepArgs(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "sce=",                p->filters[7]);
    parseCommaSepArgs(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "reporters=",          p->filters[8]);
    parseCommaSepArgs(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "r=",                  p->filters[8]);
    // clang-format on

    int    intRes = 0;
    String strRes;

#define DOCTEST_PARSE_AS_BOOL_OR_FLAG(name, sname, var, default)                                   \
    if(parseIntOption(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX name "=", option_bool, intRes) ||  \
       parseIntOption(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX sname "=", option_bool, intRes))   \
        p->var = static_cast<bool>(intRes);                                                        \
    else if(parseFlag(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX name) ||                           \
            parseFlag(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX sname))                            \
        p->var = true;                                                                             \
    else if(withDefaults)                                                                          \
    p->var = default

#define DOCTEST_PARSE_INT_OPTION(name, sname, var, default)                                        \
    if(parseIntOption(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX name "=", option_int, intRes) ||   \
       parseIntOption(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX sname "=", option_int, intRes))    \
        p->var = intRes;                                                                           \
    else if(withDefaults)                                                                          \
    p->var = default

#define DOCTEST_PARSE_STR_OPTION(name, sname, var, default)                                        \
    if(parseOption(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX name "=", &strRes, default) ||        \
       parseOption(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX sname "=", &strRes, default) ||       \
       withDefaults)                                                                               \
    p->var = strRes

    // clang-format off
    DOCTEST_PARSE_STR_OPTION("out", "o", out, "");
    DOCTEST_PARSE_STR_OPTION("order-by", "ob", order_by, "file");
    DOCTEST_PARSE_INT_OPTION("rand-seed", "rs", rand_seed, 0);

    DOCTEST_PARSE_INT_OPTION("first", "f", first, 0);
    DOCTEST_PARSE_INT_OPTION("last", "l", last, UINT_MAX);

    DOCTEST_PARSE_INT_OPTION("abort-after", "aa", abort_after, 0);
    DOCTEST_PARSE_INT_OPTION("subcase-filter-levels", "scfl", subcase_filter_levels, INT_MAX);

    DOCTEST_PARSE_AS_BOOL_OR_FLAG("success", "s", success, false);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG("case-sensitive", "cs", case_sensitive, false);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG("exit", "e", exit, false);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG("duration", "d", duration, false);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG("minimal", "m", minimal, false);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG("quiet", "q", quiet, false);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG("no-throw", "nt", no_throw, false);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG("no-exitcode", "ne", no_exitcode, false);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG("no-run", "nr", no_run, false);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG("no-intro", "ni", no_intro, false);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG("no-version", "nv", no_version, false);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG("no-colors", "nc", no_colors, false);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG("force-colors", "fc", force_colors, false);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG("no-breaks", "nb", no_breaks, false);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG("no-skip", "ns", no_skip, false);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG("gnu-file-line", "gfl", gnu_file_line, !bool(DOCTEST_MSVC));
    DOCTEST_PARSE_AS_BOOL_OR_FLAG("no-path-filenames", "npf", no_path_in_filenames, false);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG("no-line-numbers", "nln", no_line_numbers, false);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG("no-debug-output", "ndo", no_debug_output, false);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG("no-skipped-summary", "nss", no_skipped_summary, false);
    DOCTEST_PARSE_AS_BOOL_OR_FLAG("no-time-in-output", "ntio", no_time_in_output, false);
    // clang-format on

    if(withDefaults) {
        p->help             = false;
        p->version          = false;
        p->count            = false;
        p->list_test_cases  = false;
        p->list_test_suites = false;
        p->list_reporters   = false;
    }
    if(parseFlag(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "help") ||
       parseFlag(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "h") ||
       parseFlag(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "?")) {
        p->help = true;
        p->exit = true;
    }
    if(parseFlag(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "version") ||
       parseFlag(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "v")) {
        p->version = true;
        p->exit    = true;
    }
    if(parseFlag(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "count") ||
       parseFlag(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "c")) {
        p->count = true;
        p->exit  = true;
    }
    if(parseFlag(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "list-test-cases") ||
       parseFlag(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "ltc")) {
        p->list_test_cases = true;
        p->exit            = true;
    }
    if(parseFlag(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "list-test-suites") ||
       parseFlag(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "lts")) {
        p->list_test_suites = true;
        p->exit             = true;
    }
    if(parseFlag(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "list-reporters") ||
       parseFlag(argc, argv, DOCTEST_CONFIG_OPTIONS_PREFIX "lr")) {
        p->list_reporters = true;
        p->exit           = true;
    }
}